

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

Value * DumpCTestProperty(Value *__return_storage_ptr__,string *name,Value *value)

{
  Value *pVVar1;
  Value *extraout_RAX;
  Value VStack_68;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_40,name);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  Json::Value::Value(&VStack_68,value);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"value");
  Json::Value::operator=(pVVar1,&VStack_68);
  Json::Value::~Value(&VStack_68);
  return extraout_RAX;
}

Assistant:

static Json::Value DumpCTestProperty(std::string const& name,
                                     Json::Value value)
{
  Json::Value property = Json::objectValue;
  property["name"] = name;
  property["value"] = std::move(value);
  return property;
}